

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O3

tHalfEdge __thiscall MeshLib::Solid::idHalfedge(Solid *this,int id0,int id1)

{
  tEdge pEVar1;
  HalfEdge *pHVar2;
  TopologyException *this_00;
  
  pEVar1 = idEdge(this,id0,id1);
  if (pEVar1 == (tEdge)0x0) {
    this_00 = (TopologyException *)__cxa_allocate_exception(8);
    TopologyException::TopologyException(this_00);
LAB_001102c9:
    __cxa_throw(this_00,&TopologyException::typeinfo,TopologyException::~TopologyException);
  }
  pHVar2 = pEVar1->m_halfedge[0];
  if ((pHVar2->m_prev->m_vertex->m_id != id0) || (pHVar2->m_vertex->m_id != id1)) {
    pHVar2 = pEVar1->m_halfedge[1];
    if ((pHVar2->m_prev->m_vertex->m_id != id0) || (pHVar2->m_vertex->m_id != id1)) {
      this_00 = (TopologyException *)__cxa_allocate_exception(8);
      TopologyException::TopologyException(this_00);
      goto LAB_001102c9;
    }
  }
  return pHVar2;
}

Assistant:

Solid::tHalfEdge Solid::idHalfedge( int id0, int id1 )
{
	tEdge e = idEdge( id0, id1 );
	if(! e ) throw TopologyException();;
	tHalfEdge he = e->halfedge(0);
	if( he->source()->id() == id0 && he->target()->id() == id1 ) return he;
	he = e->halfedge(1);
	if( he->source()->id() != id0 || he->target()->id() != id1 ) throw TopologyException();
	return he;
}